

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool iter_new_container_partial_init(roaring_uint32_iterator_t *newit)

{
  container_t *pcVar1;
  roaring_uint32_iterator_t *newit_local;
  
  newit->in_container_index = 0;
  newit->run_index = 0;
  newit->current_value = 0;
  if ((newit->container_index < (newit->parent->high_low_container).size) &&
     (-1 < newit->container_index)) {
    newit->has_value = true;
    newit->container = (newit->parent->high_low_container).containers[newit->container_index];
    newit->typecode = (newit->parent->high_low_container).typecodes[newit->container_index];
    newit->highbits = (uint)(newit->parent->high_low_container).keys[newit->container_index] << 0x10
    ;
    pcVar1 = container_unwrap_shared(newit->container,&newit->typecode);
    newit->container = pcVar1;
    newit_local._7_1_ = (_Bool)(newit->has_value & 1);
  }
  else {
    newit->current_value = 0xffffffff;
    newit->has_value = false;
    newit_local._7_1_ = false;
  }
  return newit_local._7_1_;
}

Assistant:

static bool iter_new_container_partial_init(roaring_uint32_iterator_t *newit) {
    newit->in_container_index = 0;
    newit->run_index = 0;
    newit->current_value = 0;
    if (newit->container_index >= newit->parent->high_low_container.size ||
        newit->container_index < 0) {
        newit->current_value = UINT32_MAX;
        return (newit->has_value = false);
    }
    // assume not empty
    newit->has_value = true;
    // we precompute container, typecode and highbits so that successive
    // iterators do not have to grab them from odd memory locations
    // and have to worry about the (easily predicted) container_unwrap_shared
    // call.
    newit->container =
            newit->parent->high_low_container.containers[newit->container_index];
    newit->typecode =
            newit->parent->high_low_container.typecodes[newit->container_index];
    newit->highbits =
            ((uint32_t)
                    newit->parent->high_low_container.keys[newit->container_index])
                    << 16;
    newit->container =
            container_unwrap_shared(newit->container, &(newit->typecode));
    return newit->has_value;
}